

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O2

void __thiscall ftxui::InputBase::~InputBase(InputBase *this)

{
  (this->super_WideInputBase).super_ComponentBase._vptr_ComponentBase =
       (_func_int **)&PTR__InputBase_001682e0;
  std::__cxx11::wstring::~wstring((wstring *)&this->wrapped_content_);
  std::__cxx11::string::~string((string *)&this->content_);
  WideInputBase::~WideInputBase(&this->super_WideInputBase);
  return;
}

Assistant:

InputBase(StringRef content,
            ConstStringRef placeholder,
            Ref<InputOption> option)
      : WideInputBase(&wrapped_content_,
                      std::move(placeholder),
                      std::move(option)),
        content_(std::move(content)),
        wrapped_content_(to_wstring(*content_)) {}